

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ParenthesizedConditionalDirectiveExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ParenthesizedConditionalDirectiveExpressionSyntax,slang::syntax::ParenthesizedConditionalDirectiveExpressionSyntax_const&>
          (BumpAllocator *this,ParenthesizedConditionalDirectiveExpressionSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  ConditionalDirectiveExpressionSyntax *pCVar4;
  Info *pIVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  SyntaxKind SVar13;
  undefined4 uVar14;
  ParenthesizedConditionalDirectiveExpressionSyntax *pPVar15;
  
  pPVar15 = (ParenthesizedConditionalDirectiveExpressionSyntax *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ParenthesizedConditionalDirectiveExpressionSyntax *)this->endPtr < pPVar15 + 1) {
    pPVar15 = (ParenthesizedConditionalDirectiveExpressionSyntax *)allocateSlow(this,0x40,8);
  }
  else {
    this->head->current = (byte *)(pPVar15 + 1);
  }
  SVar13 = (args->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.kind;
  uVar14 = *(undefined4 *)
            &(args->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.previewNode;
  TVar9 = (args->openParen).kind;
  uVar10 = (args->openParen).field_0x2;
  NVar11.raw = (args->openParen).numFlags.raw;
  uVar12 = (args->openParen).rawLen;
  pIVar3 = (args->openParen).info;
  pCVar4 = (args->operand).ptr;
  uVar6 = (args->closeParen).field_0x2;
  NVar7.raw = (args->closeParen).numFlags.raw;
  uVar8 = (args->closeParen).rawLen;
  pIVar5 = (args->closeParen).info;
  (pPVar15->closeParen).kind = (args->closeParen).kind;
  (pPVar15->closeParen).field_0x2 = uVar6;
  (pPVar15->closeParen).numFlags = (NumericTokenFlags)NVar7.raw;
  (pPVar15->closeParen).rawLen = uVar8;
  (pPVar15->closeParen).info = pIVar5;
  (pPVar15->openParen).info = pIVar3;
  (pPVar15->operand).ptr = pCVar4;
  (pPVar15->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pPVar15->openParen).kind = TVar9;
  (pPVar15->openParen).field_0x2 = uVar10;
  (pPVar15->openParen).numFlags = (NumericTokenFlags)NVar11.raw;
  (pPVar15->openParen).rawLen = uVar12;
  (pPVar15->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.kind = SVar13;
  *(undefined4 *)&(pPVar15->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.field_0x4 =
       uVar14;
  (pPVar15->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.parent = pSVar1;
  return pPVar15;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }